

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q20utility.h
# Opt level: O0

void q20::detail::checkTypeCompatibility<int,unsigned_int>(void)

{
  return;
}

Assistant:

constexpr void checkTypeCompatibility() noexcept
{
    // Both T and U are standard integer types or extended integer types,
    // see https://eel.is/c++draft/utility.intcmp#1
    static_assert(QtPrivate::is_standard_or_extended_integer_type_v<T>,
                  "Integer types should be used for left T class.");
    static_assert(QtPrivate::is_standard_or_extended_integer_type_v<U>,
                  "Integer types should be used for right U class.");
}